

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_x87load(ASMState *as,IRRef ref)

{
  IRIns *pIVar1;
  ushort uVar2;
  MCode MVar3;
  int32_t iVar4;
  Reg rb;
  MCode *p;
  MCode *pMVar5;
  
  pIVar1 = as->ir + ref;
  if ((pIVar1->field_1).o == 'Y') {
    if (((((pIVar1->field_0).op2 != 0x1d3) || (-1 < (char)(pIVar1->field_1).r)) ||
        ((pIVar1->field_1).s != '\0')) ||
       ((uVar2 = (pIVar1->field_0).op1, -1 < (short)uVar2 || ((uint)uVar2 <= as->fuseref))))
    goto LAB_0013b858;
    iVar4 = ra_spill(as,as->ir + (uint)uVar2);
    pMVar5 = as->mcp;
    if (iVar4 == 0) {
      MVar3 = '\x04';
    }
    else if ((char)(MCode)iVar4 == iVar4) {
      pMVar5[-1] = (MCode)iVar4;
      pMVar5 = pMVar5 + -1;
      MVar3 = 'D';
    }
    else {
      *(int32_t *)(pMVar5 + -4) = iVar4;
      pMVar5 = pMVar5 + -4;
      MVar3 = 0x84;
    }
    pMVar5[-1] = '$';
    pMVar5[-2] = MVar3;
    pMVar5[-3] = 0xdb;
    pMVar5 = pMVar5 + -3;
  }
  else {
    if ((pIVar1->field_1).o != '\x1c') {
LAB_0013b858:
      rb = asm_fuseload(as,ref,0);
      emit_mrm(as,XO_FISTTPq,0,rb);
      return;
    }
    pMVar5 = as->mcp;
    if (pIVar1[1] == (IRIns)0x3ff0000000000000) {
      pMVar5[-2] = 0xd9;
      pMVar5[-1] = 0xe8;
    }
    else {
      if (pIVar1[1] != (IRIns)0x0) {
        *(int *)(pMVar5 + -4) = (int)pIVar1 + 8;
        pMVar5[-5] = '%';
        pMVar5[-7] = 0xdd;
        pMVar5[-6] = '\x04';
        pMVar5 = pMVar5 + -7;
        goto LAB_0013b895;
      }
      pMVar5[-2] = 0xd9;
      pMVar5[-1] = 0xee;
    }
    pMVar5 = pMVar5 + -2;
  }
LAB_0013b895:
  as->mcp = pMVar5;
  return;
}

Assistant:

static void asm_x87load(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (ir->o == IR_KNUM) {
    cTValue *tv = ir_knum(ir);
    if (tvispzero(tv))  /* Use fldz only for +0. */
      emit_x87op(as, XI_FLDZ);
    else if (tvispone(tv))
      emit_x87op(as, XI_FLD1);
    else
      emit_rma(as, XO_FLDq, XOg_FLDq, tv);
  } else if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT && !ra_used(ir) &&
	     !irref_isk(ir->op1) && mayfuse(as, ir->op1)) {
    IRIns *iri = IR(ir->op1);
    emit_rmro(as, XO_FILDd, XOg_FILDd, RID_ESP, ra_spill(as, iri));
  } else {
    emit_mrm(as, XO_FLDq, XOg_FLDq, asm_fuseload(as, ref, RSET_EMPTY));
  }
}